

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::InstallCompactionResults(DBImpl *this,CompactionState *compact)

{
  long lVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  long *in_RDX;
  size_t i;
  ulong uVar5;
  long lVar6;
  
  puVar3 = (uint *)*in_RDX;
  Log((Logger *)compact[1].smallest_snapshot,"Compacted %d@%d + %d@%d files => %lld bytes",
      (ulong)(*(long *)(puVar3 + 0x32) - *(long *)(puVar3 + 0x30)) >> 3,(ulong)*puVar3,
      (ulong)(*(long *)(puVar3 + 0x38) - *(long *)(puVar3 + 0x36)) >> 3,(ulong)(*puVar3 + 1),
      in_RDX[7]);
  Compaction::AddInputDeletions((Compaction *)*in_RDX,&((Compaction *)*in_RDX)->edit_);
  iVar2 = *(int *)*in_RDX;
  lVar6 = 0x30;
  for (uVar5 = 0; lVar4 = in_RDX[2], uVar5 < (ulong)((in_RDX[3] - lVar4) / 0x50); uVar5 = uVar5 + 1)
  {
    lVar1 = lVar4 + lVar6;
    VersionEdit::AddFile
              ((VersionEdit *)(*in_RDX + 0x18),iVar2 + 1,*(uint64_t *)(lVar1 + -0x30),
               *(uint64_t *)(lVar1 + -0x28),(InternalKey *)(lVar1 + -0x20),
               (InternalKey *)(lVar4 + lVar6));
    lVar6 = lVar6 + 0x50;
  }
  VersionSet::LogAndApply
            ((VersionSet *)this,(VersionEdit *)compact[8].outfile,(Mutex *)(*in_RDX + 0x18));
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::InstallCompactionResults(CompactionState* compact) {
  mutex_.AssertHeld();
  Log(options_.info_log, "Compacted %d@%d + %d@%d files => %lld bytes",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1), compact->compaction->level() + 1,
      static_cast<long long>(compact->total_bytes));

  // Add compaction outputs
  compact->compaction->AddInputDeletions(compact->compaction->edit());
  const int level = compact->compaction->level();
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    compact->compaction->edit()->AddFile(level + 1, out.number, out.file_size,
                                         out.smallest, out.largest);
  }
  return versions_->LogAndApply(compact->compaction->edit(), &mutex_);
}